

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall MeCab::whatlog::~whatlog(whatlog *this)

{
  std::__cxx11::string::~string((string *)&this->str_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

const char *str() {
    str_ = stream_.str();
    return str_.c_str();
  }